

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall gss::innards::Proof::recover_adjacency_lines(Proof *this,int g,int p,int n,int t)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar2;
  undefined1 auVar3 [16];
  iterator iVar4;
  ostream *poVar5;
  long lVar6;
  _Tuple_impl<0UL,_long,_long,_long,_long> local_38;
  
  auVar3 = vpinsrd_avx(ZEXT416((uint)t),n,1);
  auVar3 = vpinsrd_avx(auVar3,p,2);
  auVar3 = vpinsrd_avx(auVar3,g,3);
  local_38 = (_Tuple_impl<0UL,_long,_long,_long,_long>)vpmovsxdq_avx2(auVar3);
  iVar4 = std::
          _Rb_tree<std::tuple<long,_long,_long,_long>,_std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find(&(((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  adjacency_lines)._M_t,(key_type *)&local_38);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if ((iVar4._M_node != (_Base_ptr)((long)&(_Var1._M_head_impl)->adjacency_lines + 8U)) &&
     (*(long *)(iVar4._M_node + 3) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((_Var1._M_head_impl)->proof_stream)._M_t,"# 0\n",4);
    uVar2._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar2._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,"red ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)
                        uVar2._M_t.
                        super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                        ._M_head_impl,*(char **)(iVar4._M_node + 2),(long)iVar4._M_node[2]._M_parent
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ; ;\n",5);
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    lVar6 = (_Var1._M_head_impl)->proof_line + 1;
    (_Var1._M_head_impl)->proof_line = lVar6;
    *(long *)(iVar4._M_node + 3) = lVar6;
    uVar2._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = ((_Var1._M_head_impl)->proof_stream)._M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar2._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,"# ",2);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((void *)uVar2._M_t.
                                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                ._M_head_impl,
                        ((this->_imp)._M_t.
                         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                        active_level);
    local_38.super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
    super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_38,1);
  }
  return;
}

Assistant:

auto Proof::recover_adjacency_lines(int g, int p, int n, int t) -> void
{
    auto it = _imp->adjacency_lines.find(tuple{g, p, n, t});
    if (it != _imp->adjacency_lines.end() && 0 == get<1>(it->second)) {
        *_imp->proof_stream << "# 0\n";
        *_imp->proof_stream << "red " << get<2>(it->second) << " ; ;\n";
        get<1>(it->second) = ++_imp->proof_line;
        *_imp->proof_stream << "# " << _imp->active_level << '\n';
    }
}